

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_sse4.c
# Opt level: O3

int64_t aom_sse_sse4_1(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int width,int height)

{
  long lVar1;
  undefined1 (*pauVar2) [16];
  long lVar3;
  long lVar4;
  int iVar5;
  undefined1 (*pauVar6) [16];
  int iVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_XMM2 [16];
  __m128i v_b_w;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_XMM11 [16];
  
  if (width < 0x20) {
    if (width == 4) {
      iVar5 = 0;
      auVar32 = (undefined1  [16])0x0;
      do {
        auVar14._4_4_ = *(undefined4 *)(a + a_stride);
        auVar14._0_4_ = *(undefined4 *)a;
        auVar14._8_8_ = 0;
        auVar21 = pmovzxbw(auVar14,auVar14);
        auVar24._4_4_ = *(undefined4 *)(b + b_stride);
        auVar24._0_4_ = *(undefined4 *)b;
        auVar24._8_8_ = 0;
        auVar25 = pmovzxbw(auVar24,auVar24);
        auVar15._0_2_ = auVar21._0_2_ - auVar25._0_2_;
        auVar15._2_2_ = auVar21._2_2_ - auVar25._2_2_;
        auVar15._4_2_ = auVar21._4_2_ - auVar25._4_2_;
        auVar15._6_2_ = auVar21._6_2_ - auVar25._6_2_;
        auVar15._8_2_ = auVar21._8_2_ - auVar25._8_2_;
        auVar15._10_2_ = auVar21._10_2_ - auVar25._10_2_;
        auVar15._12_2_ = auVar21._12_2_ - auVar25._12_2_;
        auVar15._14_2_ = auVar21._14_2_ - auVar25._14_2_;
        in_XMM1 = pmaddwd(auVar15,auVar15);
        auVar21._0_4_ = auVar32._0_4_ + in_XMM1._0_4_;
        auVar21._4_4_ = auVar32._4_4_ + in_XMM1._4_4_;
        auVar21._8_4_ = auVar32._8_4_ + in_XMM1._8_4_;
        auVar21._12_4_ = auVar32._12_4_ + in_XMM1._12_4_;
        a = a + a_stride * 2;
        b = b + b_stride * 2;
        iVar5 = iVar5 + 2;
        auVar32 = auVar21;
      } while (iVar5 < height);
      goto LAB_0034402c;
    }
    if (width == 8) {
      iVar5 = 1;
      if (1 < height) {
        iVar5 = height;
      }
      auVar32 = (undefined1  [16])0x0;
      do {
        auVar21 = pmovzxbw(in_XMM1,*(undefined8 *)a);
        in_XMM2 = pmovzxbw(in_XMM2,*(undefined8 *)b);
        auVar19._0_2_ = auVar21._0_2_ - in_XMM2._0_2_;
        auVar19._2_2_ = auVar21._2_2_ - in_XMM2._2_2_;
        auVar19._4_2_ = auVar21._4_2_ - in_XMM2._4_2_;
        auVar19._6_2_ = auVar21._6_2_ - in_XMM2._6_2_;
        auVar19._8_2_ = auVar21._8_2_ - in_XMM2._8_2_;
        auVar19._10_2_ = auVar21._10_2_ - in_XMM2._10_2_;
        auVar19._12_2_ = auVar21._12_2_ - in_XMM2._12_2_;
        auVar19._14_2_ = auVar21._14_2_ - in_XMM2._14_2_;
        in_XMM1 = pmaddwd(auVar19,auVar19);
        auVar21._0_4_ = auVar32._0_4_ + in_XMM1._0_4_;
        auVar21._4_4_ = auVar32._4_4_ + in_XMM1._4_4_;
        auVar21._8_4_ = auVar32._8_4_ + in_XMM1._8_4_;
        auVar21._12_4_ = auVar32._12_4_ + in_XMM1._12_4_;
        a = a + a_stride;
        b = b + b_stride;
        iVar5 = iVar5 + -1;
        auVar32 = auVar21;
      } while (iVar5 != 0);
      goto LAB_0034402c;
    }
    if (width == 0x10) {
      iVar5 = 1;
      if (1 < height) {
        iVar5 = height;
      }
      in_XMM1 = (undefined1  [16])0x0;
      auVar21 = (undefined1  [16])0x0;
      do {
        auVar32 = *(undefined1 (*) [16])a;
        auVar25 = *(undefined1 (*) [16])b;
        auVar30 = pmovzxbw(in_XMM4,auVar32);
        in_XMM5 = pmovzxbw(in_XMM5,auVar25);
        auVar31._0_2_ = auVar30._0_2_ - in_XMM5._0_2_;
        auVar31._2_2_ = auVar30._2_2_ - in_XMM5._2_2_;
        auVar31._4_2_ = auVar30._4_2_ - in_XMM5._4_2_;
        auVar31._6_2_ = auVar30._6_2_ - in_XMM5._6_2_;
        auVar31._8_2_ = auVar30._8_2_ - in_XMM5._8_2_;
        auVar31._10_2_ = auVar30._10_2_ - in_XMM5._10_2_;
        auVar31._12_2_ = auVar30._12_2_ - in_XMM5._12_2_;
        auVar31._14_2_ = auVar30._14_2_ - in_XMM5._14_2_;
        auVar9._0_2_ = (ushort)auVar32[8] - (ushort)auVar25[8];
        auVar9._2_2_ = (ushort)auVar32[9] - (ushort)auVar25[9];
        auVar9._4_2_ = (ushort)auVar32[10] - (ushort)auVar25[10];
        auVar9._6_2_ = (ushort)auVar32[0xb] - (ushort)auVar25[0xb];
        auVar9._8_2_ = (ushort)auVar32[0xc] - (ushort)auVar25[0xc];
        auVar9._10_2_ = (ushort)auVar32[0xd] - (ushort)auVar25[0xd];
        auVar9._12_2_ = (ushort)auVar32[0xe] - (ushort)auVar25[0xe];
        auVar9._14_2_ = (ushort)auVar32[0xf] - (ushort)auVar25[0xf];
        auVar32 = pmaddwd(auVar31,auVar31);
        in_XMM4._0_4_ = auVar32._0_4_ + auVar21._0_4_;
        in_XMM4._4_4_ = auVar32._4_4_ + auVar21._4_4_;
        in_XMM4._8_4_ = auVar32._8_4_ + auVar21._8_4_;
        in_XMM4._12_4_ = auVar32._12_4_ + auVar21._12_4_;
        auVar32 = pmaddwd(auVar9,auVar9);
        auVar21._0_4_ = auVar32._0_4_ + in_XMM4._0_4_;
        auVar21._4_4_ = auVar32._4_4_ + in_XMM4._4_4_;
        auVar21._8_4_ = auVar32._8_4_ + in_XMM4._8_4_;
        auVar21._12_4_ = auVar32._12_4_ + in_XMM4._12_4_;
        a = *(undefined1 (*) [16])a + a_stride;
        b = *(undefined1 (*) [16])b + b_stride;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      goto LAB_0034402c;
    }
  }
  else {
    if (width == 0x20) {
      iVar5 = 1;
      if (1 < height) {
        iVar5 = height;
      }
      pauVar2 = (undefined1 (*) [16])(b + 0x10);
      pauVar6 = (undefined1 (*) [16])(a + 0x10);
      in_XMM1 = (undefined1  [16])0x0;
      auVar21 = (undefined1  [16])0x0;
      do {
        auVar32 = pauVar6[-1];
        auVar25 = *pauVar6;
        auVar59 = pmovzxbw(in_XMM3,auVar32);
        auVar30 = pauVar2[-1];
        auVar40 = *pauVar2;
        in_XMM7 = pmovzxbw(in_XMM7,auVar30);
        auVar34._0_2_ = auVar59._0_2_ - in_XMM7._0_2_;
        auVar34._2_2_ = auVar59._2_2_ - in_XMM7._2_2_;
        auVar34._4_2_ = auVar59._4_2_ - in_XMM7._4_2_;
        auVar34._6_2_ = auVar59._6_2_ - in_XMM7._6_2_;
        auVar34._8_2_ = auVar59._8_2_ - in_XMM7._8_2_;
        auVar34._10_2_ = auVar59._10_2_ - in_XMM7._10_2_;
        auVar34._12_2_ = auVar59._12_2_ - in_XMM7._12_2_;
        auVar34._14_2_ = auVar59._14_2_ - in_XMM7._14_2_;
        auVar46._0_2_ = CONCAT11(0,auVar30[8]);
        auVar46[2] = auVar30[9];
        auVar46[3] = 0;
        auVar46[4] = auVar30[10];
        auVar46[5] = 0;
        auVar46[6] = auVar30[0xb];
        auVar46[7] = 0;
        auVar46[8] = auVar30[0xc];
        auVar46[9] = 0;
        auVar46[10] = auVar30[0xd];
        auVar46[0xb] = 0;
        auVar46[0xc] = auVar30[0xe];
        auVar46[0xd] = 0;
        auVar46[0xe] = auVar30[0xf];
        auVar46[0xf] = 0;
        auVar59._0_2_ = auVar32[8] - auVar46._0_2_;
        auVar59._2_2_ = (ushort)auVar32[9] - (ushort)auVar30[9];
        auVar59._4_2_ = (ushort)auVar32[10] - (ushort)auVar30[10];
        auVar59._6_2_ = (ushort)auVar32[0xb] - (ushort)auVar30[0xb];
        auVar59._8_2_ = (ushort)auVar32[0xc] - (ushort)auVar30[0xc];
        auVar59._10_2_ = (ushort)auVar32[0xd] - (ushort)auVar30[0xd];
        auVar59._12_2_ = (ushort)auVar32[0xe] - (ushort)auVar30[0xe];
        auVar59._14_2_ = (ushort)auVar32[0xf] - (ushort)auVar30[0xf];
        auVar32 = pmaddwd(auVar34,auVar34);
        in_XMM3._0_4_ = auVar32._0_4_ + auVar21._0_4_;
        in_XMM3._4_4_ = auVar32._4_4_ + auVar21._4_4_;
        in_XMM3._8_4_ = auVar32._8_4_ + auVar21._8_4_;
        in_XMM3._12_4_ = auVar32._12_4_ + auVar21._12_4_;
        auVar30 = pmaddwd(auVar59,auVar59);
        auVar21 = pmovzxbw(auVar21,auVar25);
        auVar32 = pmovzxbw(auVar46,auVar40);
        auVar39._0_2_ = auVar21._0_2_ - auVar32._0_2_;
        auVar39._2_2_ = auVar21._2_2_ - auVar32._2_2_;
        auVar39._4_2_ = auVar21._4_2_ - auVar32._4_2_;
        auVar39._6_2_ = auVar21._6_2_ - auVar32._6_2_;
        auVar39._8_2_ = auVar21._8_2_ - auVar32._8_2_;
        auVar39._10_2_ = auVar21._10_2_ - auVar32._10_2_;
        auVar39._12_2_ = auVar21._12_2_ - auVar32._12_2_;
        auVar39._14_2_ = auVar21._14_2_ - auVar32._14_2_;
        auVar32._0_2_ = (ushort)auVar25[8] - (ushort)auVar40[8];
        auVar32._2_2_ = (ushort)auVar25[9] - (ushort)auVar40[9];
        auVar32._4_2_ = (ushort)auVar25[10] - (ushort)auVar40[10];
        auVar32._6_2_ = (ushort)auVar25[0xb] - (ushort)auVar40[0xb];
        auVar32._8_2_ = (ushort)auVar25[0xc] - (ushort)auVar40[0xc];
        auVar32._10_2_ = (ushort)auVar25[0xd] - (ushort)auVar40[0xd];
        auVar32._12_2_ = (ushort)auVar25[0xe] - (ushort)auVar40[0xe];
        auVar32._14_2_ = (ushort)auVar25[0xf] - (ushort)auVar40[0xf];
        auVar25 = pmaddwd(auVar39,auVar39);
        auVar32 = pmaddwd(auVar32,auVar32);
        auVar21._0_4_ = auVar32._0_4_ + auVar25._0_4_ + auVar30._0_4_ + in_XMM3._0_4_;
        auVar21._4_4_ = auVar32._4_4_ + auVar25._4_4_ + auVar30._4_4_ + in_XMM3._4_4_;
        auVar21._8_4_ = auVar32._8_4_ + auVar25._8_4_ + auVar30._8_4_ + in_XMM3._8_4_;
        auVar21._12_4_ = auVar32._12_4_ + auVar25._12_4_ + auVar30._12_4_ + in_XMM3._12_4_;
        pauVar2 = (undefined1 (*) [16])(*pauVar2 + b_stride);
        pauVar6 = (undefined1 (*) [16])(*pauVar6 + a_stride);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      goto LAB_0034402c;
    }
    if (width == 0x40) {
      iVar5 = 1;
      if (1 < height) {
        iVar5 = height;
      }
      pauVar2 = (undefined1 (*) [16])(b + 0x30);
      pauVar6 = (undefined1 (*) [16])(a + 0x30);
      in_XMM1 = (undefined1  [16])0x0;
      auVar21 = (undefined1  [16])0x0;
      do {
        auVar32 = pauVar6[-3];
        auVar25 = pauVar6[-2];
        auVar30 = pauVar6[-1];
        auVar40 = *pauVar6;
        auVar53 = pmovzxbw(in_XMM8,auVar32);
        auVar59 = pauVar2[-3];
        auVar34 = pauVar2[-2];
        auVar39 = pauVar2[-1];
        auVar46 = *pauVar2;
        in_XMM11 = pmovzxbw(in_XMM11,auVar59);
        auVar56._0_2_ = auVar53._0_2_ - in_XMM11._0_2_;
        auVar56._2_2_ = auVar53._2_2_ - in_XMM11._2_2_;
        auVar56._4_2_ = auVar53._4_2_ - in_XMM11._4_2_;
        auVar56._6_2_ = auVar53._6_2_ - in_XMM11._6_2_;
        auVar56._8_2_ = auVar53._8_2_ - in_XMM11._8_2_;
        auVar56._10_2_ = auVar53._10_2_ - in_XMM11._10_2_;
        auVar56._12_2_ = auVar53._12_2_ - in_XMM11._12_2_;
        auVar56._14_2_ = auVar53._14_2_ - in_XMM11._14_2_;
        auVar60._0_2_ = CONCAT11(0,auVar59[8]);
        auVar60[2] = auVar59[9];
        auVar60[3] = 0;
        auVar60[4] = auVar59[10];
        auVar60[5] = 0;
        auVar60[6] = auVar59[0xb];
        auVar60[7] = 0;
        auVar60[8] = auVar59[0xc];
        auVar60[9] = 0;
        auVar60[10] = auVar59[0xd];
        auVar60[0xb] = 0;
        auVar60[0xc] = auVar59[0xe];
        auVar60[0xd] = 0;
        auVar60[0xe] = auVar59[0xf];
        auVar60[0xf] = 0;
        auVar47._0_2_ = auVar32[8] - auVar60._0_2_;
        auVar47._2_2_ = (ushort)auVar32[9] - (ushort)auVar59[9];
        auVar47._4_2_ = (ushort)auVar32[10] - (ushort)auVar59[10];
        auVar47._6_2_ = (ushort)auVar32[0xb] - (ushort)auVar59[0xb];
        auVar47._8_2_ = (ushort)auVar32[0xc] - (ushort)auVar59[0xc];
        auVar47._10_2_ = (ushort)auVar32[0xd] - (ushort)auVar59[0xd];
        auVar47._12_2_ = (ushort)auVar32[0xe] - (ushort)auVar59[0xe];
        auVar47._14_2_ = (ushort)auVar32[0xf] - (ushort)auVar59[0xf];
        auVar32 = pmaddwd(auVar56,auVar56);
        auVar57._0_4_ = auVar32._0_4_ + auVar21._0_4_;
        auVar57._4_4_ = auVar32._4_4_ + auVar21._4_4_;
        auVar57._8_4_ = auVar32._8_4_ + auVar21._8_4_;
        auVar57._12_4_ = auVar32._12_4_ + auVar21._12_4_;
        auVar47 = pmaddwd(auVar47,auVar47);
        auVar21 = pmovzxbw(auVar21,auVar25);
        auVar32 = pmovzxbw(auVar60,auVar34);
        auVar52._0_2_ = auVar21._0_2_ - auVar32._0_2_;
        auVar52._2_2_ = auVar21._2_2_ - auVar32._2_2_;
        auVar52._4_2_ = auVar21._4_2_ - auVar32._4_2_;
        auVar52._6_2_ = auVar21._6_2_ - auVar32._6_2_;
        auVar52._8_2_ = auVar21._8_2_ - auVar32._8_2_;
        auVar52._10_2_ = auVar21._10_2_ - auVar32._10_2_;
        auVar52._12_2_ = auVar21._12_2_ - auVar32._12_2_;
        auVar52._14_2_ = auVar21._14_2_ - auVar32._14_2_;
        auVar51._0_2_ = (ushort)auVar25[8] - (ushort)auVar34[8];
        auVar51._2_2_ = (ushort)auVar25[9] - (ushort)auVar34[9];
        auVar51._4_2_ = (ushort)auVar25[10] - (ushort)auVar34[10];
        auVar51._6_2_ = (ushort)auVar25[0xb] - (ushort)auVar34[0xb];
        auVar51._8_2_ = (ushort)auVar25[0xc] - (ushort)auVar34[0xc];
        auVar51._10_2_ = (ushort)auVar25[0xd] - (ushort)auVar34[0xd];
        auVar51._12_2_ = (ushort)auVar25[0xe] - (ushort)auVar34[0xe];
        auVar51._14_2_ = (ushort)auVar25[0xf] - (ushort)auVar34[0xf];
        auVar52 = pmaddwd(auVar52,auVar52);
        auVar59 = pmaddwd(auVar51,auVar51);
        auVar21 = pmovzxbw(auVar47,auVar30);
        in_XMM8 = pmovzxbw(auVar57,auVar39);
        auVar48._0_2_ = auVar21._0_2_ - in_XMM8._0_2_;
        auVar48._2_2_ = auVar21._2_2_ - in_XMM8._2_2_;
        auVar48._4_2_ = auVar21._4_2_ - in_XMM8._4_2_;
        auVar48._6_2_ = auVar21._6_2_ - in_XMM8._6_2_;
        auVar48._8_2_ = auVar21._8_2_ - in_XMM8._8_2_;
        auVar48._10_2_ = auVar21._10_2_ - in_XMM8._10_2_;
        auVar48._12_2_ = auVar21._12_2_ - in_XMM8._12_2_;
        auVar48._14_2_ = auVar21._14_2_ - in_XMM8._14_2_;
        auVar44._0_2_ = CONCAT11(0,auVar39[8]);
        auVar44[2] = auVar39[9];
        auVar44[3] = 0;
        auVar44[4] = auVar39[10];
        auVar44[5] = 0;
        auVar44[6] = auVar39[0xb];
        auVar44[7] = 0;
        auVar44[8] = auVar39[0xc];
        auVar44[9] = 0;
        auVar44[10] = auVar39[0xd];
        auVar44[0xb] = 0;
        auVar44[0xc] = auVar39[0xe];
        auVar44[0xd] = 0;
        auVar44[0xe] = auVar39[0xf];
        auVar44[0xf] = 0;
        auVar53._0_2_ = auVar30[8] - auVar44._0_2_;
        auVar53._2_2_ = (ushort)auVar30[9] - (ushort)auVar39[9];
        auVar53._4_2_ = (ushort)auVar30[10] - (ushort)auVar39[10];
        auVar53._6_2_ = (ushort)auVar30[0xb] - (ushort)auVar39[0xb];
        auVar53._8_2_ = (ushort)auVar30[0xc] - (ushort)auVar39[0xc];
        auVar53._10_2_ = (ushort)auVar30[0xd] - (ushort)auVar39[0xd];
        auVar53._12_2_ = (ushort)auVar30[0xe] - (ushort)auVar39[0xe];
        auVar53._14_2_ = (ushort)auVar30[0xf] - (ushort)auVar39[0xf];
        auVar34 = pmaddwd(auVar48,auVar48);
        auVar30 = pmaddwd(auVar53,auVar53);
        auVar21 = pmovzxbw(auVar59,auVar40);
        auVar32 = pmovzxbw(auVar44,auVar46);
        auVar35._0_2_ = auVar21._0_2_ - auVar32._0_2_;
        auVar35._2_2_ = auVar21._2_2_ - auVar32._2_2_;
        auVar35._4_2_ = auVar21._4_2_ - auVar32._4_2_;
        auVar35._6_2_ = auVar21._6_2_ - auVar32._6_2_;
        auVar35._8_2_ = auVar21._8_2_ - auVar32._8_2_;
        auVar35._10_2_ = auVar21._10_2_ - auVar32._10_2_;
        auVar35._12_2_ = auVar21._12_2_ - auVar32._12_2_;
        auVar35._14_2_ = auVar21._14_2_ - auVar32._14_2_;
        auVar25._0_2_ = (ushort)auVar40[8] - (ushort)auVar46[8];
        auVar25._2_2_ = (ushort)auVar40[9] - (ushort)auVar46[9];
        auVar25._4_2_ = (ushort)auVar40[10] - (ushort)auVar46[10];
        auVar25._6_2_ = (ushort)auVar40[0xb] - (ushort)auVar46[0xb];
        auVar25._8_2_ = (ushort)auVar40[0xc] - (ushort)auVar46[0xc];
        auVar25._10_2_ = (ushort)auVar40[0xd] - (ushort)auVar46[0xd];
        auVar25._12_2_ = (ushort)auVar40[0xe] - (ushort)auVar46[0xe];
        auVar25._14_2_ = (ushort)auVar40[0xf] - (ushort)auVar46[0xf];
        auVar40 = pmaddwd(auVar35,auVar35);
        auVar32 = pmaddwd(auVar25,auVar25);
        auVar21._0_4_ =
             auVar32._0_4_ + auVar40._0_4_ +
             auVar30._0_4_ + auVar34._0_4_ + auVar59._0_4_ +
             auVar52._0_4_ + auVar47._0_4_ + auVar57._0_4_;
        auVar21._4_4_ =
             auVar32._4_4_ + auVar40._4_4_ +
             auVar30._4_4_ + auVar34._4_4_ + auVar59._4_4_ +
             auVar52._4_4_ + auVar47._4_4_ + auVar57._4_4_;
        auVar21._8_4_ =
             auVar32._8_4_ + auVar40._8_4_ +
             auVar30._8_4_ + auVar34._8_4_ + auVar59._8_4_ +
             auVar52._8_4_ + auVar47._8_4_ + auVar57._8_4_;
        auVar21._12_4_ =
             auVar32._12_4_ + auVar40._12_4_ +
             auVar30._12_4_ + auVar34._12_4_ + auVar59._12_4_ +
             auVar52._12_4_ + auVar47._12_4_ + auVar57._12_4_;
        pauVar2 = (undefined1 (*) [16])(*pauVar2 + b_stride);
        pauVar6 = (undefined1 (*) [16])(*pauVar6 + a_stride);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      goto LAB_0034402c;
    }
    if (width == 0x80) {
      iVar5 = 1;
      if (1 < height) {
        iVar5 = height;
      }
      pauVar2 = (undefined1 (*) [16])(b + 0x70);
      pauVar6 = (undefined1 (*) [16])(a + 0x70);
      in_XMM1 = (undefined1  [16])0x0;
      auVar21 = (undefined1  [16])0x0;
      do {
        auVar32 = pauVar6[-7];
        auVar25 = pauVar6[-6];
        auVar30 = pauVar6[-5];
        auVar40 = pauVar6[-4];
        auVar53 = pmovzxbw(in_XMM8,auVar32);
        auVar59 = pauVar2[-7];
        auVar34 = pauVar2[-6];
        auVar39 = pauVar2[-5];
        auVar46 = pauVar2[-4];
        in_XMM11 = pmovzxbw(in_XMM11,auVar59);
        auVar54._0_2_ = auVar53._0_2_ - in_XMM11._0_2_;
        auVar54._2_2_ = auVar53._2_2_ - in_XMM11._2_2_;
        auVar54._4_2_ = auVar53._4_2_ - in_XMM11._4_2_;
        auVar54._6_2_ = auVar53._6_2_ - in_XMM11._6_2_;
        auVar54._8_2_ = auVar53._8_2_ - in_XMM11._8_2_;
        auVar54._10_2_ = auVar53._10_2_ - in_XMM11._10_2_;
        auVar54._12_2_ = auVar53._12_2_ - in_XMM11._12_2_;
        auVar54._14_2_ = auVar53._14_2_ - in_XMM11._14_2_;
        auVar58._0_2_ = CONCAT11(0,auVar59[8]);
        auVar58[2] = auVar59[9];
        auVar58[3] = 0;
        auVar58[4] = auVar59[10];
        auVar58[5] = 0;
        auVar58[6] = auVar59[0xb];
        auVar58[7] = 0;
        auVar58[8] = auVar59[0xc];
        auVar58[9] = 0;
        auVar58[10] = auVar59[0xd];
        auVar58[0xb] = 0;
        auVar58[0xc] = auVar59[0xe];
        auVar58[0xd] = 0;
        auVar58[0xe] = auVar59[0xf];
        auVar58[0xf] = 0;
        auVar49._0_2_ = auVar32[8] - auVar58._0_2_;
        auVar49._2_2_ = (ushort)auVar32[9] - (ushort)auVar59[9];
        auVar49._4_2_ = (ushort)auVar32[10] - (ushort)auVar59[10];
        auVar49._6_2_ = (ushort)auVar32[0xb] - (ushort)auVar59[0xb];
        auVar49._8_2_ = (ushort)auVar32[0xc] - (ushort)auVar59[0xc];
        auVar49._10_2_ = (ushort)auVar32[0xd] - (ushort)auVar59[0xd];
        auVar49._12_2_ = (ushort)auVar32[0xe] - (ushort)auVar59[0xe];
        auVar49._14_2_ = (ushort)auVar32[0xf] - (ushort)auVar59[0xf];
        auVar32 = pmaddwd(auVar54,auVar54);
        auVar55._0_4_ = auVar32._0_4_ + auVar21._0_4_;
        auVar55._4_4_ = auVar32._4_4_ + auVar21._4_4_;
        auVar55._8_4_ = auVar32._8_4_ + auVar21._8_4_;
        auVar55._12_4_ = auVar32._12_4_ + auVar21._12_4_;
        auVar32 = pmaddwd(auVar49,auVar49);
        auVar21 = pmovzxbw(auVar21,auVar25);
        auVar59 = pmovzxbw(auVar58,auVar34);
        auVar10._0_2_ = auVar21._0_2_ - auVar59._0_2_;
        auVar10._2_2_ = auVar21._2_2_ - auVar59._2_2_;
        auVar10._4_2_ = auVar21._4_2_ - auVar59._4_2_;
        auVar10._6_2_ = auVar21._6_2_ - auVar59._6_2_;
        auVar10._8_2_ = auVar21._8_2_ - auVar59._8_2_;
        auVar10._10_2_ = auVar21._10_2_ - auVar59._10_2_;
        auVar10._12_2_ = auVar21._12_2_ - auVar59._12_2_;
        auVar10._14_2_ = auVar21._14_2_ - auVar59._14_2_;
        auVar36._0_2_ = (ushort)auVar25[8] - (ushort)auVar34[8];
        auVar36._2_2_ = (ushort)auVar25[9] - (ushort)auVar34[9];
        auVar36._4_2_ = (ushort)auVar25[10] - (ushort)auVar34[10];
        auVar36._6_2_ = (ushort)auVar25[0xb] - (ushort)auVar34[0xb];
        auVar36._8_2_ = (ushort)auVar25[0xc] - (ushort)auVar34[0xc];
        auVar36._10_2_ = (ushort)auVar25[0xd] - (ushort)auVar34[0xd];
        auVar36._12_2_ = (ushort)auVar25[0xe] - (ushort)auVar34[0xe];
        auVar36._14_2_ = (ushort)auVar25[0xf] - (ushort)auVar34[0xf];
        auVar21 = pmaddwd(auVar10,auVar10);
        auVar11._0_4_ = auVar21._0_4_ + auVar32._0_4_ + auVar55._0_4_;
        auVar11._4_4_ = auVar21._4_4_ + auVar32._4_4_ + auVar55._4_4_;
        auVar11._8_4_ = auVar21._8_4_ + auVar32._8_4_ + auVar55._8_4_;
        auVar11._12_4_ = auVar21._12_4_ + auVar32._12_4_ + auVar55._12_4_;
        auVar53 = pmaddwd(auVar36,auVar36);
        auVar21 = pmovzxbw(auVar32,auVar30);
        in_XMM8 = pmovzxbw(auVar55,auVar39);
        auVar50._0_2_ = auVar21._0_2_ - in_XMM8._0_2_;
        auVar50._2_2_ = auVar21._2_2_ - in_XMM8._2_2_;
        auVar50._4_2_ = auVar21._4_2_ - in_XMM8._4_2_;
        auVar50._6_2_ = auVar21._6_2_ - in_XMM8._6_2_;
        auVar50._8_2_ = auVar21._8_2_ - in_XMM8._8_2_;
        auVar50._10_2_ = auVar21._10_2_ - in_XMM8._10_2_;
        auVar50._12_2_ = auVar21._12_2_ - in_XMM8._12_2_;
        auVar50._14_2_ = auVar21._14_2_ - in_XMM8._14_2_;
        auVar45._0_2_ = CONCAT11(0,auVar39[8]);
        auVar45[2] = auVar39[9];
        auVar45[3] = 0;
        auVar45[4] = auVar39[10];
        auVar45[5] = 0;
        auVar45[6] = auVar39[0xb];
        auVar45[7] = 0;
        auVar45[8] = auVar39[0xc];
        auVar45[9] = 0;
        auVar45[10] = auVar39[0xd];
        auVar45[0xb] = 0;
        auVar45[0xc] = auVar39[0xe];
        auVar45[0xd] = 0;
        auVar45[0xe] = auVar39[0xf];
        auVar45[0xf] = 0;
        auVar22._0_2_ = auVar30[8] - auVar45._0_2_;
        auVar22._2_2_ = (ushort)auVar30[9] - (ushort)auVar39[9];
        auVar22._4_2_ = (ushort)auVar30[10] - (ushort)auVar39[10];
        auVar22._6_2_ = (ushort)auVar30[0xb] - (ushort)auVar39[0xb];
        auVar22._8_2_ = (ushort)auVar30[0xc] - (ushort)auVar39[0xc];
        auVar22._10_2_ = (ushort)auVar30[0xd] - (ushort)auVar39[0xd];
        auVar22._12_2_ = (ushort)auVar30[0xe] - (ushort)auVar39[0xe];
        auVar22._14_2_ = (ushort)auVar30[0xf] - (ushort)auVar39[0xf];
        auVar51 = pmaddwd(auVar50,auVar50);
        auVar59 = pmaddwd(auVar22,auVar22);
        auVar21 = pmovzxbw(auVar11,auVar40);
        auVar25 = pmovzxbw(auVar53,auVar46);
        auVar30._0_2_ = auVar21._0_2_ - auVar25._0_2_;
        auVar30._2_2_ = auVar21._2_2_ - auVar25._2_2_;
        auVar30._4_2_ = auVar21._4_2_ - auVar25._4_2_;
        auVar30._6_2_ = auVar21._6_2_ - auVar25._6_2_;
        auVar30._8_2_ = auVar21._8_2_ - auVar25._8_2_;
        auVar30._10_2_ = auVar21._10_2_ - auVar25._10_2_;
        auVar30._12_2_ = auVar21._12_2_ - auVar25._12_2_;
        auVar30._14_2_ = auVar21._14_2_ - auVar25._14_2_;
        auVar27._0_2_ = (ushort)auVar40[8] - (ushort)auVar46[8];
        auVar27._2_2_ = (ushort)auVar40[9] - (ushort)auVar46[9];
        auVar27._4_2_ = (ushort)auVar40[10] - (ushort)auVar46[10];
        auVar27._6_2_ = (ushort)auVar40[0xb] - (ushort)auVar46[0xb];
        auVar27._8_2_ = (ushort)auVar40[0xc] - (ushort)auVar46[0xc];
        auVar27._10_2_ = (ushort)auVar40[0xd] - (ushort)auVar46[0xd];
        auVar27._12_2_ = (ushort)auVar40[0xe] - (ushort)auVar46[0xe];
        auVar27._14_2_ = (ushort)auVar40[0xf] - (ushort)auVar46[0xf];
        auVar21 = pmaddwd(auVar30,auVar30);
        auVar32 = pmaddwd(auVar27,auVar27);
        auVar28._0_4_ = auVar32._0_4_ + auVar21._0_4_;
        auVar28._4_4_ = auVar32._4_4_ + auVar21._4_4_;
        auVar28._8_4_ = auVar32._8_4_ + auVar21._8_4_;
        auVar28._12_4_ = auVar32._12_4_ + auVar21._12_4_;
        auVar21 = pauVar6[-3];
        auVar32 = pauVar2[-3];
        auVar25 = pmovzxbw(auVar25,auVar21);
        auVar46 = pmovzxbw(auVar45,auVar32);
        auVar37._0_2_ = auVar25._0_2_ - auVar46._0_2_;
        auVar37._2_2_ = auVar25._2_2_ - auVar46._2_2_;
        auVar37._4_2_ = auVar25._4_2_ - auVar46._4_2_;
        auVar37._6_2_ = auVar25._6_2_ - auVar46._6_2_;
        auVar37._8_2_ = auVar25._8_2_ - auVar46._8_2_;
        auVar37._10_2_ = auVar25._10_2_ - auVar46._10_2_;
        auVar37._12_2_ = auVar25._12_2_ - auVar46._12_2_;
        auVar37._14_2_ = auVar25._14_2_ - auVar46._14_2_;
        auVar33._0_2_ = (ushort)auVar21[8] - (ushort)auVar32[8];
        auVar33._2_2_ = (ushort)auVar21[9] - (ushort)auVar32[9];
        auVar33._4_2_ = (ushort)auVar21[10] - (ushort)auVar32[10];
        auVar33._6_2_ = (ushort)auVar21[0xb] - (ushort)auVar32[0xb];
        auVar33._8_2_ = (ushort)auVar21[0xc] - (ushort)auVar32[0xc];
        auVar33._10_2_ = (ushort)auVar21[0xd] - (ushort)auVar32[0xd];
        auVar33._12_2_ = (ushort)auVar21[0xe] - (ushort)auVar32[0xe];
        auVar33._14_2_ = (ushort)auVar21[0xf] - (ushort)auVar32[0xf];
        auVar21 = pmaddwd(auVar37,auVar37);
        auVar38._0_4_ = auVar21._0_4_ + auVar28._0_4_;
        auVar38._4_4_ = auVar21._4_4_ + auVar28._4_4_;
        auVar38._8_4_ = auVar21._8_4_ + auVar28._8_4_;
        auVar38._12_4_ = auVar21._12_4_ + auVar28._12_4_;
        auVar34 = pmaddwd(auVar33,auVar33);
        auVar21 = pauVar6[-2];
        auVar32 = pauVar2[-2];
        auVar25 = pmovzxbw(auVar28,auVar21);
        auVar39 = pmovzxbw(auVar38,auVar32);
        auVar29._0_2_ = auVar25._0_2_ - auVar39._0_2_;
        auVar29._2_2_ = auVar25._2_2_ - auVar39._2_2_;
        auVar29._4_2_ = auVar25._4_2_ - auVar39._4_2_;
        auVar29._6_2_ = auVar25._6_2_ - auVar39._6_2_;
        auVar29._8_2_ = auVar25._8_2_ - auVar39._8_2_;
        auVar29._10_2_ = auVar25._10_2_ - auVar39._10_2_;
        auVar29._12_2_ = auVar25._12_2_ - auVar39._12_2_;
        auVar29._14_2_ = auVar25._14_2_ - auVar39._14_2_;
        auVar40._0_2_ = (ushort)auVar21[8] - (ushort)auVar32[8];
        auVar40._2_2_ = (ushort)auVar21[9] - (ushort)auVar32[9];
        auVar40._4_2_ = (ushort)auVar21[10] - (ushort)auVar32[10];
        auVar40._6_2_ = (ushort)auVar21[0xb] - (ushort)auVar32[0xb];
        auVar40._8_2_ = (ushort)auVar21[0xc] - (ushort)auVar32[0xc];
        auVar40._10_2_ = (ushort)auVar21[0xd] - (ushort)auVar32[0xd];
        auVar40._12_2_ = (ushort)auVar21[0xe] - (ushort)auVar32[0xe];
        auVar40._14_2_ = (ushort)auVar21[0xf] - (ushort)auVar32[0xf];
        auVar30 = pmaddwd(auVar29,auVar29);
        auVar25 = pmaddwd(auVar40,auVar40);
        auVar21 = pauVar6[-1];
        auVar32 = pauVar2[-1];
        auVar40 = pmovzxbw(auVar39,auVar21);
        auVar39 = pmovzxbw(auVar46,auVar32);
        auVar41._0_2_ = auVar40._0_2_ - auVar39._0_2_;
        auVar41._2_2_ = auVar40._2_2_ - auVar39._2_2_;
        auVar41._4_2_ = auVar40._4_2_ - auVar39._4_2_;
        auVar41._6_2_ = auVar40._6_2_ - auVar39._6_2_;
        auVar41._8_2_ = auVar40._8_2_ - auVar39._8_2_;
        auVar41._10_2_ = auVar40._10_2_ - auVar39._10_2_;
        auVar41._12_2_ = auVar40._12_2_ - auVar39._12_2_;
        auVar41._14_2_ = auVar40._14_2_ - auVar39._14_2_;
        auVar23._0_2_ = (ushort)auVar21[8] - (ushort)auVar32[8];
        auVar23._2_2_ = (ushort)auVar21[9] - (ushort)auVar32[9];
        auVar23._4_2_ = (ushort)auVar21[10] - (ushort)auVar32[10];
        auVar23._6_2_ = (ushort)auVar21[0xb] - (ushort)auVar32[0xb];
        auVar23._8_2_ = (ushort)auVar21[0xc] - (ushort)auVar32[0xc];
        auVar23._10_2_ = (ushort)auVar21[0xd] - (ushort)auVar32[0xd];
        auVar23._12_2_ = (ushort)auVar21[0xe] - (ushort)auVar32[0xe];
        auVar23._14_2_ = (ushort)auVar21[0xf] - (ushort)auVar32[0xf];
        auVar21 = pmaddwd(auVar41,auVar41);
        auVar42._0_4_ = auVar21._0_4_ + auVar25._0_4_ + auVar30._0_4_;
        auVar42._4_4_ = auVar21._4_4_ + auVar25._4_4_ + auVar30._4_4_;
        auVar42._8_4_ = auVar21._8_4_ + auVar25._8_4_ + auVar30._8_4_;
        auVar42._12_4_ = auVar21._12_4_ + auVar25._12_4_ + auVar30._12_4_;
        auVar25 = pmaddwd(auVar23,auVar23);
        auVar21 = *pauVar6;
        auVar32 = *pauVar2;
        auVar30 = pmovzxbw(auVar42,auVar21);
        auVar40 = pmovzxbw(auVar39,auVar32);
        auVar43._0_2_ = auVar30._0_2_ - auVar40._0_2_;
        auVar43._2_2_ = auVar30._2_2_ - auVar40._2_2_;
        auVar43._4_2_ = auVar30._4_2_ - auVar40._4_2_;
        auVar43._6_2_ = auVar30._6_2_ - auVar40._6_2_;
        auVar43._8_2_ = auVar30._8_2_ - auVar40._8_2_;
        auVar43._10_2_ = auVar30._10_2_ - auVar40._10_2_;
        auVar43._12_2_ = auVar30._12_2_ - auVar40._12_2_;
        auVar43._14_2_ = auVar30._14_2_ - auVar40._14_2_;
        auVar12._0_2_ = (ushort)auVar21[8] - (ushort)auVar32[8];
        auVar12._2_2_ = (ushort)auVar21[9] - (ushort)auVar32[9];
        auVar12._4_2_ = (ushort)auVar21[10] - (ushort)auVar32[10];
        auVar12._6_2_ = (ushort)auVar21[0xb] - (ushort)auVar32[0xb];
        auVar12._8_2_ = (ushort)auVar21[0xc] - (ushort)auVar32[0xc];
        auVar12._10_2_ = (ushort)auVar21[0xd] - (ushort)auVar32[0xd];
        auVar12._12_2_ = (ushort)auVar21[0xe] - (ushort)auVar32[0xe];
        auVar12._14_2_ = (ushort)auVar21[0xf] - (ushort)auVar32[0xf];
        auVar30 = pmaddwd(auVar43,auVar43);
        auVar32 = pmaddwd(auVar12,auVar12);
        auVar21._0_4_ =
             auVar32._0_4_ +
             auVar30._0_4_ + auVar25._0_4_ + auVar42._0_4_ +
             auVar34._0_4_ + auVar38._0_4_ +
             auVar59._0_4_ + auVar51._0_4_ + auVar53._0_4_ + auVar11._0_4_;
        auVar21._4_4_ =
             auVar32._4_4_ +
             auVar30._4_4_ + auVar25._4_4_ + auVar42._4_4_ +
             auVar34._4_4_ + auVar38._4_4_ +
             auVar59._4_4_ + auVar51._4_4_ + auVar53._4_4_ + auVar11._4_4_;
        auVar21._8_4_ =
             auVar32._8_4_ +
             auVar30._8_4_ + auVar25._8_4_ + auVar42._8_4_ +
             auVar34._8_4_ + auVar38._8_4_ +
             auVar59._8_4_ + auVar51._8_4_ + auVar53._8_4_ + auVar11._8_4_;
        auVar21._12_4_ =
             auVar32._12_4_ +
             auVar30._12_4_ + auVar25._12_4_ + auVar42._12_4_ +
             auVar34._12_4_ + auVar38._12_4_ +
             auVar59._12_4_ + auVar51._12_4_ + auVar53._12_4_ + auVar11._12_4_;
        pauVar2 = (undefined1 (*) [16])(*pauVar2 + b_stride);
        pauVar6 = (undefined1 (*) [16])(*pauVar6 + a_stride);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      goto LAB_0034402c;
    }
  }
  lVar1 = (long)a_stride;
  lVar8 = (long)b_stride;
  if ((width & 7U) == 0) {
    iVar5 = 1;
    if (1 < height) {
      iVar5 = height;
    }
    iVar7 = 0;
    auVar21 = (undefined1  [16])0x0;
    do {
      lVar4 = 0;
      auVar32 = auVar21;
      do {
        auVar21 = pmovzxbw(in_XMM1,*(undefined8 *)(a + lVar4));
        in_XMM2 = pmovzxbw(in_XMM2,*(undefined8 *)(b + lVar4));
        auVar20._0_2_ = auVar21._0_2_ - in_XMM2._0_2_;
        auVar20._2_2_ = auVar21._2_2_ - in_XMM2._2_2_;
        auVar20._4_2_ = auVar21._4_2_ - in_XMM2._4_2_;
        auVar20._6_2_ = auVar21._6_2_ - in_XMM2._6_2_;
        auVar20._8_2_ = auVar21._8_2_ - in_XMM2._8_2_;
        auVar20._10_2_ = auVar21._10_2_ - in_XMM2._10_2_;
        auVar20._12_2_ = auVar21._12_2_ - in_XMM2._12_2_;
        auVar20._14_2_ = auVar21._14_2_ - in_XMM2._14_2_;
        in_XMM1 = pmaddwd(auVar20,auVar20);
        auVar21._0_4_ = auVar32._0_4_ + in_XMM1._0_4_;
        auVar21._4_4_ = auVar32._4_4_ + in_XMM1._4_4_;
        auVar21._8_4_ = auVar32._8_4_ + in_XMM1._8_4_;
        auVar21._12_4_ = auVar32._12_4_ + in_XMM1._12_4_;
        lVar4 = lVar4 + 8;
        auVar32 = auVar21;
      } while (lVar4 < width);
      a = a + lVar1;
      b = b + lVar8;
      iVar7 = iVar7 + 1;
    } while (iVar7 != iVar5);
  }
  else {
    iVar5 = 0;
    auVar21 = (undefined1  [16])0x0;
    do {
      lVar4 = -8;
      do {
        lVar3 = lVar4;
        auVar32 = pmovzxbw(in_XMM1,*(undefined8 *)(a + lVar3 + 8));
        auVar25 = pmovzxbw(in_XMM2,*(undefined8 *)(b + lVar3 + 8));
        auVar16._0_2_ = auVar32._0_2_ - auVar25._0_2_;
        auVar16._2_2_ = auVar32._2_2_ - auVar25._2_2_;
        auVar16._4_2_ = auVar32._4_2_ - auVar25._4_2_;
        auVar16._6_2_ = auVar32._6_2_ - auVar25._6_2_;
        auVar16._8_2_ = auVar32._8_2_ - auVar25._8_2_;
        auVar16._10_2_ = auVar32._10_2_ - auVar25._10_2_;
        auVar16._12_2_ = auVar32._12_2_ - auVar25._12_2_;
        auVar16._14_2_ = auVar32._14_2_ - auVar25._14_2_;
        auVar32 = pmaddwd(auVar16,auVar16);
        in_XMM1._0_4_ = auVar32._0_4_ + auVar21._0_4_;
        in_XMM1._4_4_ = auVar32._4_4_ + auVar21._4_4_;
        in_XMM1._8_4_ = auVar32._8_4_ + auVar21._8_4_;
        in_XMM1._12_4_ = auVar32._12_4_ + auVar21._12_4_;
        auVar21 = pmovzxbw(auVar21,*(undefined8 *)(a + lVar3 + lVar1 + 8));
        in_XMM2 = pmovzxbw(auVar25,*(undefined8 *)(b + lVar3 + lVar8 + 8));
        auVar13._0_2_ = auVar21._0_2_ - in_XMM2._0_2_;
        auVar13._2_2_ = auVar21._2_2_ - in_XMM2._2_2_;
        auVar13._4_2_ = auVar21._4_2_ - in_XMM2._4_2_;
        auVar13._6_2_ = auVar21._6_2_ - in_XMM2._6_2_;
        auVar13._8_2_ = auVar21._8_2_ - in_XMM2._8_2_;
        auVar13._10_2_ = auVar21._10_2_ - in_XMM2._10_2_;
        auVar13._12_2_ = auVar21._12_2_ - in_XMM2._12_2_;
        auVar13._14_2_ = auVar21._14_2_ - in_XMM2._14_2_;
        auVar32 = pmaddwd(auVar13,auVar13);
        auVar21._0_4_ = auVar32._0_4_ + in_XMM1._0_4_;
        auVar21._4_4_ = auVar32._4_4_ + in_XMM1._4_4_;
        auVar21._8_4_ = auVar32._8_4_ + in_XMM1._8_4_;
        auVar21._12_4_ = auVar32._12_4_ + in_XMM1._12_4_;
        lVar4 = lVar3 + 8;
      } while (lVar4 < (long)width + -0xc);
      auVar17._4_4_ = *(undefined4 *)(a + lVar1 + 8 + lVar4);
      auVar17._0_4_ = *(undefined4 *)(a + lVar3 + 0x10);
      auVar17._8_8_ = 0;
      auVar32 = pmovzxbw(auVar17,auVar17);
      auVar26._4_4_ = *(undefined4 *)(b + lVar8 + 8 + lVar4);
      auVar26._0_4_ = *(undefined4 *)(b + lVar3 + 0x10);
      auVar26._8_8_ = 0;
      in_XMM2 = pmovzxbw(auVar26,auVar26);
      auVar18._0_2_ = auVar32._0_2_ - in_XMM2._0_2_;
      auVar18._2_2_ = auVar32._2_2_ - in_XMM2._2_2_;
      auVar18._4_2_ = auVar32._4_2_ - in_XMM2._4_2_;
      auVar18._6_2_ = auVar32._6_2_ - in_XMM2._6_2_;
      auVar18._8_2_ = auVar32._8_2_ - in_XMM2._8_2_;
      auVar18._10_2_ = auVar32._10_2_ - in_XMM2._10_2_;
      auVar18._12_2_ = auVar32._12_2_ - in_XMM2._12_2_;
      auVar18._14_2_ = auVar32._14_2_ - in_XMM2._14_2_;
      in_XMM1 = pmaddwd(auVar18,auVar18);
      auVar21._0_4_ = auVar21._0_4_ + in_XMM1._0_4_;
      auVar21._4_4_ = auVar21._4_4_ + in_XMM1._4_4_;
      auVar21._8_4_ = auVar21._8_4_ + in_XMM1._8_4_;
      auVar21._12_4_ = auVar21._12_4_ + in_XMM1._12_4_;
      a = a + a_stride * 2;
      b = b + b_stride * 2;
      iVar5 = iVar5 + 2;
    } while (iVar5 < height);
  }
LAB_0034402c:
  auVar32 = pmovzxdq(in_XMM1,auVar21);
  return (ulong)auVar21._12_4_ + auVar32._8_8_ + (ulong)auVar21._8_4_ + auVar32._0_8_;
}

Assistant:

int64_t aom_sse_sse4_1(const uint8_t *a, int a_stride, const uint8_t *b,
                       int b_stride, int width, int height) {
  int y = 0;
  int64_t sse = 0;
  __m128i sum = _mm_setzero_si128();
  switch (width) {
    case 4:
      do {
        sse4x2_sse4_1(a, a_stride, b, b_stride, &sum);
        a += a_stride << 1;
        b += b_stride << 1;
        y += 2;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 8:
      do {
        sse8_sse4_1(a, b, &sum);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 16:
      do {
        sse_w16_sse4_1(&sum, a, b);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 32:
      do {
        sse_w16_sse4_1(&sum, a, b);
        sse_w16_sse4_1(&sum, a + 16, b + 16);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 64:
      do {
        sse_w16_sse4_1(&sum, a, b);
        sse_w16_sse4_1(&sum, a + 16 * 1, b + 16 * 1);
        sse_w16_sse4_1(&sum, a + 16 * 2, b + 16 * 2);
        sse_w16_sse4_1(&sum, a + 16 * 3, b + 16 * 3);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 128:
      do {
        sse_w16_sse4_1(&sum, a, b);
        sse_w16_sse4_1(&sum, a + 16 * 1, b + 16 * 1);
        sse_w16_sse4_1(&sum, a + 16 * 2, b + 16 * 2);
        sse_w16_sse4_1(&sum, a + 16 * 3, b + 16 * 3);
        sse_w16_sse4_1(&sum, a + 16 * 4, b + 16 * 4);
        sse_w16_sse4_1(&sum, a + 16 * 5, b + 16 * 5);
        sse_w16_sse4_1(&sum, a + 16 * 6, b + 16 * 6);
        sse_w16_sse4_1(&sum, a + 16 * 7, b + 16 * 7);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    default:
      if (width & 0x07) {
        do {
          int i = 0;
          do {
            sse8_sse4_1(a + i, b + i, &sum);
            sse8_sse4_1(a + i + a_stride, b + i + b_stride, &sum);
            i += 8;
          } while (i + 4 < width);
          sse4x2_sse4_1(a + i, a_stride, b + i, b_stride, &sum);
          a += (a_stride << 1);
          b += (b_stride << 1);
          y += 2;
        } while (y < height);
      } else {
        do {
          int i = 0;
          do {
            sse8_sse4_1(a + i, b + i, &sum);
            i += 8;
          } while (i < width);
          a += a_stride;
          b += b_stride;
          y += 1;
        } while (y < height);
      }
      sse = summary_all_sse4(&sum);
      break;
  }

  return sse;
}